

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O1

void __thiscall create::Data::Data(Data *this,ProtocolVersion version)

{
  _Rb_tree_header *p_Var1;
  pointer *ppuVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  iterator __position;
  Packet *pPVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  key_type local_49;
  Packet *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  int local_2c;
  
  p_Var1 = &(this->packets)._M_t._M_impl.super__Rb_tree_header;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (version != ~V_ALL) {
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[17]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [17])"bumps_wheeldrops");
    local_49 = '\a';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[5]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [5])0x1490ab);
    local_49 = '\b';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[11]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [11])"cliff_left");
    local_49 = '\t';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[17]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [17])"cliff_front_left");
    local_49 = '\n';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[18]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [18])"cliff_front_right");
    local_49 = '\v';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[12]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [12])"cliff_right");
    local_49 = '\f';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[13]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [13])"virtual_wall");
    local_49 = '\r';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[13]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [13])"overcurrents");
    local_49 = '\x0e';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[17]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [17])"dirt_detect_left");
    local_49 = '\x0f';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if ((version & V_1) != ~V_ALL) {
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[18]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [18])"dirt_detect_right");
    local_49 = '\x10';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if (version != ~V_ALL) {
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[10]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [10])"ir_opcode");
    local_49 = '\x11';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[8]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [8])"buttons");
    local_49 = '\x12';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if ((version & (V_2|V_1)) != ~V_ALL) {
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[9]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [9])"distance");
    local_49 = '\x13';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[6]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [6])"angle");
    local_49 = '\x14';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if (version != ~V_ALL) {
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[15]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [15])"charging_state");
    local_49 = '\x15';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[8]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [8])"voltage");
    local_49 = '\x16';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[8]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [8])"current");
    local_49 = '\x17';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[12]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [12])"temperature");
    local_49 = '\x18';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[15]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [15])"battery_charge");
    local_49 = '\x19';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[17]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [17])"battery_capacity");
    local_49 = '\x1a';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if ((version & (V_3|V_2)) != ~V_ALL) {
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[8]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [8])"oi_mode");
    local_49 = '#';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  if ((version & V_3) != ~V_ALL) {
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[16]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [16])"enc_counts_left");
    local_49 = '+';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[17]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [17])"enc_counts_right");
    local_49 = ',';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[13]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [13])"light_bumper");
    local_49 = '-';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[18]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [18])"light_bumper_left");
    local_49 = '.';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[24]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [24])"light_bumper_front_left");
    local_49 = '/';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[25]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [25])"light_bumper_center_left");
    local_49 = '0';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[26]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [26])"light_bumper_center_right");
    local_49 = '1';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[25]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [25])"light_bumper_front_right");
    local_49 = '2';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 2;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[19]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [19])"light_bumper_right");
    local_49 = '3';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[15]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [15])"ir_opcode_left");
    local_49 = '4';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[16]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [16])"ir_opcode_right");
    local_49 = '5';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    local_2c = 1;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<create::Packet,std::allocator<create::Packet>,int,char_const(&)[7]>
              (a_Stack_40,&local_48,(allocator<create::Packet> *)&local_49,&local_2c,
               (char (*) [7])"stasis");
    local_49 = ':';
    pmVar6 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_49);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    pPVar4 = local_48;
    local_48 = (Packet *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pPVar4;
    (pmVar6->super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var5._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
  }
  this->totalDataBytes = 0;
  for (p_Var7 = (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    __position._M_current =
         (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->ids,__position,
                 (uchar *)(p_Var7 + 1));
    }
    else {
      *__position._M_current = (char)p_Var7[1]._M_color;
      ppuVar2 = &(this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + 1;
    }
    this->totalDataBytes = this->totalDataBytes + (uint)*(byte *)&p_Var7[1]._M_parent[2]._M_right;
  }
  return;
}

Assistant:

Data::Data(ProtocolVersion version) {
    // Populate data map
    /* * * * * * * * * * * * * * * * * * * * * * * * * * * * * * *
     *  WARNING: Adding too many packets will flood the serial   *
     *           buffer and corrupt the stream.                  *
     * * * * * * * * * * * * * * * * * * * * * * * * * * * * * * */
    ADD_PACKET(ID_BUMP_WHEELDROP, 1, "bumps_wheeldrops", V_ALL);
    ADD_PACKET(ID_WALL, 1, "wall", V_ALL);
    ADD_PACKET(ID_CLIFF_LEFT, 1, "cliff_left", V_ALL);
    ADD_PACKET(ID_CLIFF_FRONT_LEFT, 1, "cliff_front_left", V_ALL);
    ADD_PACKET(ID_CLIFF_FRONT_RIGHT, 1, "cliff_front_right", V_ALL);
    ADD_PACKET(ID_CLIFF_RIGHT, 1, "cliff_right", V_ALL);
    ADD_PACKET(ID_VIRTUAL_WALL, 1, "virtual_wall", V_ALL);
    ADD_PACKET(ID_OVERCURRENTS, 1, "overcurrents", V_ALL);
    ADD_PACKET(ID_DIRT_DETECT_LEFT, 1, "dirt_detect_left", V_ALL);
    ADD_PACKET(ID_DIRT_DETECT_RIGHT, 1, "dirt_detect_right", V_1);
    ADD_PACKET(ID_IR_OMNI, 1, "ir_opcode", V_ALL);
    ADD_PACKET(ID_BUTTONS, 1, "buttons", V_ALL);
    ADD_PACKET(ID_DISTANCE, 2, "distance", V_1 | V_2);
    ADD_PACKET(ID_ANGLE, 2, "angle", V_1 | V_2);
    ADD_PACKET(ID_CHARGE_STATE, 1, "charging_state", V_ALL);
    ADD_PACKET(ID_VOLTAGE, 2, "voltage", V_ALL);
    ADD_PACKET(ID_CURRENT, 2, "current", V_ALL);
    ADD_PACKET(ID_TEMP, 1, "temperature", V_ALL);
    ADD_PACKET(ID_CHARGE , 2, "battery_charge", V_ALL);
    ADD_PACKET(ID_CAPACITY, 2, "battery_capacity", V_ALL);
    ADD_PACKET(ID_OI_MODE, 1, "oi_mode", V_2 | V_3);
    ADD_PACKET(ID_LEFT_ENC, 2, "enc_counts_left", V_3);
    ADD_PACKET(ID_RIGHT_ENC, 2, "enc_counts_right", V_3);
    ADD_PACKET(ID_LIGHT, 1, "light_bumper", V_3);
    ADD_PACKET(ID_LIGHT_LEFT, 2, "light_bumper_left", V_3);
    ADD_PACKET(ID_LIGHT_FRONT_LEFT, 2, "light_bumper_front_left", V_3);
    ADD_PACKET(ID_LIGHT_CENTER_LEFT, 2, "light_bumper_center_left", V_3);
    ADD_PACKET(ID_LIGHT_CENTER_RIGHT, 2, "light_bumper_center_right", V_3);
    ADD_PACKET(ID_LIGHT_FRONT_RIGHT, 2, "light_bumper_front_right", V_3);
    ADD_PACKET(ID_LIGHT_RIGHT, 2, "light_bumper_right", V_3);
    ADD_PACKET(ID_IR_LEFT, 1, "ir_opcode_left", V_3);
    ADD_PACKET(ID_IR_RIGHT, 1, "ir_opcode_right", V_3);
    ADD_PACKET(ID_STASIS, 1, "stasis", V_3);

    totalDataBytes = 0;
    for (std::map<uint8_t, std::shared_ptr<Packet> >::iterator it = packets.begin();
         it != packets.end();
         ++it) {
      ids.push_back(it->first);
      totalDataBytes += it->second->nbytes;
    }
  }